

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SLUFactor(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *old)

{
  pointer pnVar1;
  cpp_dec_float<200U,_int,_void> *pcVar2;
  shared_ptr<soplex::Tolerances> local_48;
  
  (this->
  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SLinSolver = (_func_int **)&PTR___cxa_pure_virtual_005469e8;
  (this->
  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).spxout = (old->
             super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::CLUFactor(&this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  (this->
  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SLinSolver = (_func_int **)&PTR_getName_00546888;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&this->vec,1);
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->ssvec,1,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this->usetup = old->usetup;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->eta,&old->eta);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->forest,&old->forest);
  (this->lastThreshold).m_backend.fpclass = cpp_dec_float_finite;
  (this->lastThreshold).m_backend.prec_elem = 0x1c;
  (this->lastThreshold).m_backend.data._M_elems[0] = 0;
  (this->lastThreshold).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->lastThreshold).m_backend.data._M_elems + 0x6d) = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->lastThreshold).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  (this->minThreshold).m_backend.fpclass = cpp_dec_float_finite;
  (this->minThreshold).m_backend.data._M_elems[0] = 0;
  (this->minThreshold).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->minThreshold).m_backend.data._M_elems + 0x6d) = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->minThreshold).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  (this->minThreshold).m_backend.prec_elem = 0x1c;
  (this->minStability).m_backend.fpclass = cpp_dec_float_finite;
  (this->minStability).m_backend.prec_elem = 0x1c;
  (this->minStability).m_backend.data._M_elems[0] = 0;
  (this->minStability).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->minStability).m_backend.data._M_elems + 0x6d) = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->minStability).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  this->timerType = old->timerType;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.elem = (Dring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).row.orig = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).row.perm = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).col.orig = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).col.perm = (int *)0x0;
  pnVar1 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).u.row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data + 8) != pnVar1) {
    *(pointer *)
     ((long)&(this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).u.row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data + 8) = pnVar1;
  }
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.elem = (Dring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.idx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.idx = (int *)0x0;
  this->solveCount = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.start = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.row = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.ridx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rbeg = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rorig = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rperm = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.idx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.start = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.len = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.max = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.start = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.len = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.max = (int *)0x0;
  assign(this,old);
  return;
}

Assistant:

SLUFactor<R>::SLUFactor(const SLUFactor<R>& old)
   : SLinSolver<R>(old)
   , vec(1)     // we don't need to copy it, because they are temporary vectors
   , ssvec(1)   // we don't need to copy it, because they are temporary vectors
   , usetup(old.usetup)
   , eta(old.eta)
   , forest(old.forest)
   , timerType(old.timerType)
{
   this->row.perm    = nullptr;
   this->row.orig    = nullptr;
   this->col.perm    = nullptr;
   this->col.orig    = nullptr;
   this->u.row.elem  = nullptr;
   this->u.row.val.clear();
   this->u.row.idx   = nullptr;
   this->u.row.start = nullptr;
   this->u.row.len   = nullptr;
   this->u.row.max   = nullptr;
   this->u.col.elem  = nullptr;
   this->u.col.idx   = nullptr;
   this->u.col.start = nullptr;
   this->u.col.len   = nullptr;
   this->u.col.max   = nullptr;
   this->l.idx       = nullptr;
   this->l.start     = nullptr;
   this->l.row       = nullptr;
   this->l.ridx      = nullptr;
   this->l.rbeg      = nullptr;
   this->l.rorig     = nullptr;
   this->l.rperm     = nullptr;

   solveCount = 0;

   try
   {
      assign(old);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }

   assert(SLUFactor<R>::isConsistent());
}